

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex_nivalis_conv.cpp
# Opt level: O1

string * nivalis::nivalis_to_latex(string *__return_storage_ptr__,string *expr_in,Environment *env)

{
  pointer pcVar1;
  long lVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  string copy;
  Expr expr;
  ostringstream strm;
  ASTNode *local_1f8 [2];
  ASTNode local_1e8;
  string local_1d8;
  Expr local_1b8;
  long *local_1a0;
  long local_198;
  long local_190;
  long lStack_188;
  ios_base local_130 [264];
  
  pcVar1 = (expr_in->_M_dataplus)._M_p;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,pcVar1,pcVar1 + expr_in->_M_string_length);
  util::trim(&local_1d8);
  if (local_1d8._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    if (*local_1d8._M_dataplus._M_p == '#') {
      std::__cxx11::string::substr((ulong)local_1f8,(ulong)&local_1d8);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_1f8,0,(char *)0x0,0x23c4d5);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_190 = *plVar5;
        lStack_188 = plVar4[3];
        local_1a0 = &local_190;
      }
      else {
        local_190 = *plVar5;
        local_1a0 = (long *)*plVar4;
      }
      local_198 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a0);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar6 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar6) {
        lVar2 = plVar4[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      }
      __return_storage_ptr__->_M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0,local_190 + 1);
      }
      if (local_1f8[0] == &local_1e8) goto LAB_001cffa5;
      uVar7 = local_1e8._0_8_ + 1;
    }
    else {
      parse(&local_1b8,expr_in,env,false,true,0,(string *)0x0);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      Expr::latex_repr(&local_1b8,(ostream *)&local_1a0,env);
      std::__cxx11::stringbuf::str();
      if (0xc < __return_storage_ptr__->_M_string_length) {
        iVar3 = std::__cxx11::string::compare((ulong)__return_storage_ptr__,0,(char *)0x6);
        if (iVar3 == 0) {
          iVar3 = std::__cxx11::string::compare
                            ((ulong)__return_storage_ptr__,
                             __return_storage_ptr__->_M_string_length - 7,(char *)0x7);
          if (iVar3 == 0) {
            std::__cxx11::string::substr((ulong)local_1f8,(ulong)__return_storage_ptr__);
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1f8);
            if (local_1f8[0] != &local_1e8) {
              operator_delete(local_1f8[0],local_1e8._0_8_ + 1);
            }
          }
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
      std::ios_base::~ios_base(local_130);
      if (local_1b8.ast.
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
          _M_impl.super__Vector_impl_data._M_start == (ASTNode *)0x0) goto LAB_001cffa5;
      uVar7 = (long)local_1b8.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)local_1b8.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_1f8[0] = local_1b8.ast.
                     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    }
    operator_delete(local_1f8[0],uVar7);
  }
LAB_001cffa5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string nivalis_to_latex(const std::string& expr_in, Environment& env) {
    std::string copy = expr_in;
    util::trim(copy);
    if (copy.empty()) return "";
    if (copy[0] == '#') return "\\text{" + copy.substr(1) + "}";
    Expr expr = parse(expr_in, env, false, true);

    std::ostringstream strm;
    expr.latex_repr(strm, env);
    std::string s = strm.str();
    if (s.size() >= 13 &&
            s.compare(0, 6, "\\left(") == 0 &&
            s.compare(s.size() - 7, 7, "\\right)") == 0) {
        s = s.substr(6, s.size() - 13);
    }
    return s;
}